

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O2

int lws_sul_earliest_wakeable_event(lws_context *ctx,lws_usec_t *pearliest)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  lws_dll2 *plVar4;
  
  puVar3 = &ctx->pt[0].pt_sul_owner[1].count;
  uVar2 = 0xffffffffffffffff;
  plVar4 = (lws_dll2 *)0x0;
  for (uVar1 = 0; ctx->count_threads != uVar1; uVar1 = uVar1 + 1) {
    if ((*puVar3 != 0) &&
       ((long)(*(lws_dll2 **)(puVar3 + -2))[1].prev < (long)plVar4 || (int)uVar2 == -1)) {
      uVar2 = uVar1 & 0xffffffff;
      plVar4 = (*(lws_dll2 **)(puVar3 + -2))[1].prev;
    }
    puVar3 = puVar3 + 0x68;
  }
  if ((int)uVar2 != -1) {
    *pearliest = (lws_usec_t)plVar4;
    return 0;
  }
  return 1;
}

Assistant:

int
lws_sul_earliest_wakeable_event(struct lws_context *ctx, lws_usec_t *pearliest)
{
	struct lws_context_per_thread *pt;
	int n = 0, hit = -1;
	lws_usec_t lowest = 0;

	for (n = 0; n < ctx->count_threads; n++) {
		pt = &ctx->pt[n];

		lws_pt_lock(pt, __func__);

		if (pt->pt_sul_owner[LWSSULLI_WAKE_IF_SUSPENDED].count) {
			lws_sorted_usec_list_t *sul = (lws_sorted_usec_list_t *)
					lws_dll2_get_head(&pt->pt_sul_owner[
					           LWSSULLI_WAKE_IF_SUSPENDED]);

			if (hit == -1 || sul->us < lowest) {
				hit = n;
				lowest = sul->us;
			}
		}

		lws_pt_unlock(pt);
	}


	if (hit == -1)
		/* there is no pending event */
		return 1;

	*pearliest = lowest;

	return 0;
}